

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

PNode * add_PNode(Parser *p,int symbol,d_loc_t *start_loc,char *e,PNode *pn,D_Reduction *r,
                 VecZNode *path,D_Shift *sh)

{
  VecPNode *v;
  uint32 *puVar1;
  AssocKind cassoc;
  D_ReductionCode p_Var2;
  PNode **ppPVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint32 uVar10;
  PNode *pn_00;
  PNode *pPVar11;
  char *pcVar12;
  ulong uVar13;
  PNode *_t_1;
  PNode *pPVar14;
  PNode *pn_01;
  PNode *pPVar15;
  PNode **ppPVar16;
  uint *hash_00;
  PNode *_t;
  PNode *pPVar17;
  uint uVar18;
  uint hash;
  VecPNode vx;
  uint local_9c;
  D_Scope *local_98;
  VecPNode local_90;
  undefined1 local_68 [24];
  PNode *pPStack_50;
  PNode *local_48;
  undefined8 uStack_40;
  D_ReductionCode *local_38;
  
  local_98 = equiv_D_Scope((pn->parse_node).scope);
  hash_00 = &local_9c;
  pn_00 = find_PNode(p,start_loc->s,e,symbol,local_98,hash_00);
  if (pn_00 != (PNode *)0x0) {
    iVar8 = PNode_equal(p,pn_00,r,path,sh);
    pPVar11 = pn_00;
    while( true ) {
      if (iVar8 != 0) {
        return pn_00;
      }
      pPVar11 = pPVar11->ambiguities;
      if (pPVar11 == (PNode *)0x0) break;
      iVar8 = PNode_equal(p,pPVar11,r,path,sh);
    }
  }
  pPVar11 = p->free_pnodes;
  uVar13 = (ulong)((p->user).sizeof_user_parse_node + 0xd0);
  if (pPVar11 == (PNode *)0x0) {
    pPVar11 = (PNode *)malloc(uVar13);
  }
  else {
    p->free_pnodes = pPVar11->all_next;
  }
  p->pnodes = p->pnodes + 1;
  memset(pPVar11,0,uVar13);
  pPVar11->hash = local_9c;
  (pPVar11->parse_node).symbol = symbol;
  pcVar12 = start_loc->pathname;
  uVar5 = *(undefined4 *)&start_loc->ws;
  uVar6 = *(undefined4 *)((long)&start_loc->ws + 4);
  iVar8 = start_loc->col;
  iVar7 = start_loc->line;
  (pPVar11->parse_node).start_loc.s = start_loc->s;
  (pPVar11->parse_node).start_loc.pathname = pcVar12;
  *(undefined4 *)&(pPVar11->parse_node).start_loc.ws = uVar5;
  *(undefined4 *)((long)&(pPVar11->parse_node).start_loc.ws + 4) = uVar6;
  (pPVar11->parse_node).start_loc.col = iVar8;
  (pPVar11->parse_node).start_loc.line = iVar7;
  pPVar11->ws_before = start_loc->ws;
  pcVar12 = e;
  if (path != (VecZNode *)0x0 && r != (D_Reduction *)0x0) {
    pcVar12 = (pn->parse_node).end;
  }
  (pPVar11->parse_node).end = pcVar12;
  (pPVar11->parse_node).end_skip = e;
  pPVar11->shift = sh;
  pPVar11->reduction = r;
  (pPVar11->parse_node).scope = (pn->parse_node).scope;
  pPVar11->initial_scope = local_98;
  pPVar11->latest = pPVar11;
  pPVar11->ws_after = e;
  if (sh == (D_Shift *)0x0) {
    if (r != (D_Reduction *)0x0) {
      if ((path != (VecZNode *)0x0) && (uVar9 = path->n - 1, -1 < (int)uVar9)) {
        v = &pPVar11->children;
        ppPVar16 = (pPVar11->children).e;
        uVar13 = (ulong)uVar9;
        do {
          pPVar14 = path->v[uVar13]->pn;
          pPVar17 = pPVar14->latest;
          pPVar15 = pPVar17->latest;
          pn_01 = pPVar17;
          if (pPVar17 != pPVar17->latest) {
            do {
              pPVar17 = pPVar15;
              pPVar17->refcount = pPVar17->refcount + 1;
              puVar1 = &pn_01->refcount;
              *puVar1 = *puVar1 - 1;
              if (*puVar1 == 0) {
                free_PNode(p,pn_01);
              }
              pPVar14->latest = pPVar17;
              pPVar15 = pPVar17->latest;
              pn_01 = pPVar17;
            } while (pPVar17 != pPVar17->latest);
          }
          pPVar17->refcount = pPVar17->refcount + 1;
          ppPVar3 = (pPVar11->children).v;
          if (ppPVar3 == (PNode **)0x0) {
            (pPVar11->children).v = ppPVar16;
            uVar9 = (pPVar11->children).n;
            (pPVar11->children).n = uVar9 + 1;
            (pPVar11->children).e[uVar9] = pPVar17;
          }
          else {
            uVar9 = v->n;
            if (ppPVar3 == ppPVar16) {
              if (2 < uVar9) goto LAB_00144bbf;
            }
            else if ((uVar9 & 7) == 0) {
LAB_00144bbf:
              vec_add_internal(v,pPVar17);
              goto LAB_00144bca;
            }
            v->n = uVar9 + 1;
            ppPVar3[uVar9] = pPVar17;
          }
LAB_00144bca:
          bVar4 = 0 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar4);
      }
      uVar9 = (pPVar11->children).n;
      if ((ulong)uVar9 == 0) {
        uVar18 = 0;
      }
      else {
        ppPVar16 = (pPVar11->children).v;
        uVar13 = 0;
        uVar18 = 0;
        do {
          pPVar14 = ppPVar16[uVar13];
          if (pPVar14->op_assoc != ASSOC_NONE) {
            pPVar11->assoc = pPVar14->op_assoc;
            pPVar11->priority = pPVar14->op_priority;
          }
          if (uVar18 <= pPVar14->height) {
            uVar18 = pPVar14->height + 1;
          }
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
      pPVar11->op_assoc = (uint)r->op_assoc;
      pPVar11->op_priority = r->op_priority;
      pPVar11->height = uVar18;
      if (r->rule_assoc != 0) {
        pPVar11->assoc = (uint)r->rule_assoc;
        pPVar11->priority = r->rule_priority;
      }
      if ((r->speculative_code != (D_ReductionCode)0x0) &&
         (iVar8 = (*r->speculative_code)(pPVar11,(pPVar11->children).v,uVar9,0x90,&p->user),
         iVar8 != 0)) goto LAB_00144c80;
      if ((path != (VecZNode *)0x0) && (uVar9 = path->n, 1 < uVar9)) {
        ppPVar16 = (pPVar11->children).v;
        uVar13 = 0;
        do {
          pPVar14 = ppPVar16[uVar13];
          cassoc = pPVar14->assoc;
          if (((cassoc != ASSOC_NONE) && (pPVar11->assoc != ASSOC_NONE)) &&
             (iVar8 = check_child(pPVar11->priority,pPVar11->assoc,pPVar14->priority,cassoc,
                                  (uint)(uVar9 - 1 == (int)uVar13),(int)hash_00), iVar8 == 0)) {
            free_PNode(p,pPVar11);
            pPVar11 = (PNode *)0x0;
            break;
          }
          uVar18 = (int)uVar13 + (uVar9 - 1);
          uVar13 = (ulong)uVar18;
        } while (uVar18 < uVar9);
      }
    }
  }
  else {
    pPVar11->op_assoc = (uint)sh->op_assoc;
    pPVar11->op_priority = sh->op_priority;
    p_Var2 = sh->speculative_code;
    if ((p_Var2 != (D_ReductionCode)0x0) && (sh->action_index != 0xffffffff)) {
      uStack_40._0_4_ = 0;
      uStack_40._4_4_ = 0;
      local_68._16_8_ = (PNode *)0x0;
      pPStack_50 = (PNode *)0x0;
      local_68._0_8_ = 0;
      local_68._8_8_ = (PNode **)0x0;
      local_38 = (D_ReductionCode *)0x0;
      local_48 = (PNode *)((ulong)(uint)sh->action_index << 0x20);
      pPVar11->reduction = (D_Reduction *)local_68;
      iVar8 = (*p_Var2)(pPVar11,(pPVar11->children).v,(pPVar11->children).n,0x90,&p->user);
      if (iVar8 == 0) {
        pPVar11->reduction = (D_Reduction *)0x0;
      }
      else {
LAB_00144c80:
        free_PNode(p,pPVar11);
        pPVar11 = (PNode *)0x0;
      }
    }
  }
  if (pn_00 == (PNode *)0x0) {
    if (pPVar11 != (PNode *)0x0) {
      insert_PNode_internal(p,pPVar11);
      pPVar11->refcount = pPVar11->refcount + 1;
      pPVar11->all_next = (p->pnode_hash).all;
      (p->pnode_hash).all = pPVar11;
      return pPVar11;
    }
    return (PNode *)0x0;
  }
  if (pPVar11 == (PNode *)0x0) {
    return pn_00;
  }
  p->compares = p->compares + 1;
  if ((((p->user).dont_use_deep_priorities_for_disambiguation == 0) &&
      (pPVar11->assoc != ASSOC_NONE)) && (pn_00->assoc != ASSOC_NONE)) {
    local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
    local_68._8_8_ = (PNode **)0x0;
    local_90.n = 0;
    local_90.v = (PNode **)0x0;
    get_unshared_pnodes(p,pPVar11,pn_00,(VecPNode *)local_68,&local_90);
    if ((PNode **)local_68._8_8_ != (PNode **)0x0) {
      qsort((void *)local_68._8_8_,local_68._0_8_ & 0xffffffff,8,prioritycmp);
    }
    iVar8 = 0;
    if (local_90.v == (PNode **)0x0) {
      ppPVar16 = (PNode **)0x0;
    }
    else {
      qsort(local_90.v,(ulong)local_90.n,8,prioritycmp);
      ppPVar16 = local_90.v;
    }
    uVar9 = local_90.n;
    if ((uint)local_68._0_4_ < local_90.n) {
      uVar9 = local_68._0_4_;
    }
    bVar4 = true;
    if (uVar9 != 0) {
      uVar13 = 0;
      do {
        if (ppPVar16[uVar13]->priority < (*(PNode **)(local_68._8_8_ + uVar13 * 8))->priority) {
          iVar8 = -1;
LAB_00144e90:
          bVar4 = false;
          break;
        }
        iVar8 = 0;
        if ((*(PNode **)(local_68._8_8_ + uVar13 * 8))->priority < ppPVar16[uVar13]->priority) {
          iVar8 = 1;
          goto LAB_00144e90;
        }
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
    if ((undefined1 *)local_68._8_8_ != local_68 + 0x10 && (PNode **)local_68._8_8_ != (PNode **)0x0
       ) {
      free((void *)local_68._8_8_);
      ppPVar16 = local_90.v;
    }
    local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
    local_68._8_8_ = (PNode **)0x0;
    if (ppPVar16 != local_90.e && ppPVar16 != (PNode **)0x0) {
      free(ppPVar16);
    }
    if (bVar4) goto LAB_00144caa;
  }
  else {
LAB_00144caa:
    if (((p->user).dont_use_greediness_for_disambiguation != 0) ||
       (iVar8 = cmp_greediness(p,pPVar11,pn_00), iVar8 == 0)) {
      if ((p->user).dont_use_height_for_disambiguation == 0) {
        if (pPVar11->height < pn_00->height) goto LAB_00144f09;
        if (pPVar11->height <= pn_00->height) goto LAB_00144cc0;
        goto LAB_00144efc;
      }
      goto LAB_00144cc0;
    }
  }
  if (iVar8 == -1) {
LAB_00144f09:
    insert_PNode_internal(p,pPVar11);
    uVar10 = pPVar11->refcount + 1;
    pPVar11->refcount = uVar10;
    pPVar11->all_next = (p->pnode_hash).all;
    (p->pnode_hash).all = pPVar11;
    pPVar14 = pn_00->latest;
    pPVar17 = pPVar14->latest;
    pPVar15 = pPVar14;
    if (pPVar14 != pPVar14->latest) {
      do {
        pPVar14 = pPVar17;
        pPVar14->refcount = pPVar14->refcount + 1;
        puVar1 = &pPVar15->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_PNode(p,pPVar15);
        }
        pn_00->latest = pPVar14;
        pPVar17 = pPVar14->latest;
        pPVar15 = pPVar14;
      } while (pPVar14 != pPVar14->latest);
      uVar10 = pPVar11->refcount;
    }
    pPVar11->refcount = uVar10 + 1;
    pPVar14->latest = pPVar11;
    return pPVar11;
  }
  if (iVar8 == 1) {
LAB_00144efc:
    free_PNode(p,pPVar11);
    return pn_00;
  }
LAB_00144cc0:
  pPVar11->refcount = pPVar11->refcount + 1;
  pPVar11->ambiguities = pn_00->ambiguities;
  pn_00->ambiguities = pPVar11;
  return pn_00;
}

Assistant:

static PNode *add_PNode(Parser *p, int symbol, d_loc_t *start_loc, char *e, PNode *pn, D_Reduction *r, VecZNode *path,
                        D_Shift *sh) {
  D_Scope *scope = equiv_D_Scope(pn->parse_node.scope);
  uint hash;
  PNode *old_pn = find_PNode(p, start_loc->s, e, symbol, scope, &hash), *new_pn;
  if (old_pn) {
    PNode *amb = 0;
    if (PNode_equal(p, old_pn, r, path, sh)) return old_pn;
    for (amb = old_pn->ambiguities; amb; amb = amb->ambiguities) {
      if (PNode_equal(p, amb, r, path, sh)) return old_pn;
    }
  }
  new_pn = make_PNode(p, hash, symbol, start_loc, e, pn, r, path, sh, scope);
  if (!old_pn) {
    old_pn = new_pn;
    if (!new_pn) return NULL;
    insert_PNode(p, new_pn);
    goto Lreturn;
  }
  if (!new_pn) goto Lreturn;
  p->compares++;
  switch (cmp_pnodes(p, new_pn, old_pn)) {
    case 0:
      ref_pn(new_pn);
      new_pn->ambiguities = old_pn->ambiguities;
      old_pn->ambiguities = new_pn;
      break;
    case -1:
      insert_PNode(p, new_pn);
      LATEST(p, old_pn);
      ref_pn(new_pn);
      old_pn->latest = new_pn;
      old_pn = new_pn;
      break;
    case 1:
      free_PNode(p, new_pn);
      break;
  }
Lreturn:
  return old_pn;
}